

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O0

QString * __thiscall
ImportBaseFuncWrapper::getShortName(QString *__return_storage_ptr__,ImportBaseFuncWrapper *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *fName;
  undefined1 local_60 [8];
  QString out;
  uint64_t val;
  undefined1 local_30 [8];
  QString functionName;
  ImportBaseFuncWrapper *this_local;
  
  functionName.d.size = (qsizetype)this;
  QString::QString((QString *)local_30);
  uVar1 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x31])();
  if ((uVar1 & 1) == 0) {
    iVar2 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
              super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x33])();
    if ((char *)CONCAT44(extraout_var_00,iVar2) == (char *)0x0) {
      QString::QString(__return_storage_ptr__,"");
      goto LAB_00147c84;
    }
    QString::operator=((QString *)local_30,(char *)CONCAT44(extraout_var_00,iVar2));
  }
  else {
    iVar2 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
              super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x32])();
    out.d.size = CONCAT44(extraout_var,iVar2);
    QString::QString((QString *)local_60);
    QString::asprintf((char *)&fName,"<ord: %llX>",out.d.size);
    QString::operator=((QString *)local_60,(QString *)&fName);
    QString::~QString((QString *)&fName);
    QString::operator=((QString *)local_30,(QString *)local_60);
    QString::~QString((QString *)local_60);
  }
  QString::QString(__return_storage_ptr__,(QString *)local_30);
LAB_00147c84:
  QString::~QString((QString *)local_30);
  return __return_storage_ptr__;
}

Assistant:

QString ImportBaseFuncWrapper::getShortName()
{
    QString functionName;
    if (isByOrdinal()) {
        uint64_t val = getOrdinal();
        QString out;
#if QT_VERSION >= 0x050000
        out = QString::asprintf("<ord: %llX>", static_cast<unsigned long long>(val));
#else
        out.sprintf("<ord: %llX>", static_cast<unsigned long long>(val));
#endif
        functionName = out;
    } else {
        char *fName = this->getFunctionName();
        if (!fName) return "";
        functionName = fName;
    }
    return functionName;
}